

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

Script * cfd::core::ScriptUtil::CreateP2wshLockingScript
                   (Script *__return_storage_ptr__,Script *redeem_script)

{
  ByteData256 script_hash;
  ByteData256 local_28;
  
  HashUtil::Sha256(&local_28,redeem_script);
  CreateP2wshLockingScript(__return_storage_ptr__,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2wshLockingScript(const Script& redeem_script) {
  // create script hash
  ByteData256 script_hash = HashUtil::Sha256(redeem_script);

  return CreateP2wshLockingScript(script_hash);
}